

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

QString * __thiscall QFileInfoPrivate::getFileName(QFileInfoPrivate *this,FileName name)

{
  bool bVar1;
  pointer pQVar2;
  uint in_EDX;
  QFileSystemMetaData *in_RSI;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QFileSystemEntry entry_1;
  QFileSystemEntry entry;
  QFileSystemEntry *in_stack_fffffffffffffd58;
  QFileSystemMetaData *in_stack_fffffffffffffd60;
  QFileSystemEntry *entry_00;
  QFileSystemEntry *entry_01;
  undefined1 in_stack_fffffffffffffd80 [16];
  uint in_stack_fffffffffffffd90;
  uint uVar3;
  undefined1 local_258 [8];
  QLatin1StringView in_stack_fffffffffffffdb0;
  undefined1 local_120 [224];
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  entry_00 = in_RDI;
  if ((-1 < (int)in_RSI[8].birthTime_) || (bVar1 = QString::isNull((QString *)0x198e6e), bVar1)) {
    uVar3 = in_stack_fffffffffffffd90 & 0xffffff;
    (in_RDI->m_filePath).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_filePath).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_filePath).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x198ec8);
    bVar1 = std::operator==((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                             *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    entry_01 = in_stack_fffffffffffffd80._0_8_;
    if (bVar1) {
      in_stack_fffffffffffffd60 = (QFileSystemMetaData *)(ulong)(in_EDX - 3);
      switch(in_stack_fffffffffffffd60) {
      case (QFileSystemMetaData *)0x0:
      case (QFileSystemMetaData *)0x1:
        memset(local_120,0xaa,0x38);
        QFileSystemEngine::absoluteName(entry_00);
        if ((int)in_RSI[8].birthTime_ < 0) {
          QFileSystemEntry::filePath(in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd60,
                             &in_stack_fffffffffffffd58->m_filePath);
          QString::~QString((QString *)0x199248);
          QFileSystemEntry::path(in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd60,
                             &in_stack_fffffffffffffd58->m_filePath);
          QString::~QString((QString *)0x199287);
        }
        if (in_EDX == 3) {
          QFileSystemEntry::filePath(in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd60,
                             &in_stack_fffffffffffffd58->m_filePath);
          QString::~QString((QString *)0x1992c2);
        }
        else {
          QFileSystemEntry::path(in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd60,
                             &in_stack_fffffffffffffd58->m_filePath);
          QString::~QString((QString *)0x1992ef);
        }
        QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_stack_fffffffffffffd60);
        break;
      case (QFileSystemMetaData *)0x2:
        QFileSystemEngine::getLinkTarget
                  ((QFileSystemEntry *)CONCAT44(in_EDX,uVar3),in_stack_fffffffffffffd80._8_8_);
        QFileSystemEntry::filePath(in_RDI);
        QString::operator=((QString *)in_stack_fffffffffffffd60,
                           &in_stack_fffffffffffffd58->m_filePath);
        QString::~QString((QString *)0x1990b5);
        QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_stack_fffffffffffffd60);
        break;
      case (QFileSystemMetaData *)0x3:
      case (QFileSystemMetaData *)0x4:
        memset(local_40,0xaa,0x38);
        QFileSystemEngine::canonicalName(entry_01,in_RSI);
        if ((int)in_RSI[8].birthTime_ < 0) {
          QFileSystemEntry::filePath(in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd60,
                             &in_stack_fffffffffffffd58->m_filePath);
          QString::~QString((QString *)0x198f9f);
          QFileSystemEntry::path(in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd60,
                             &in_stack_fffffffffffffd58->m_filePath);
          QString::~QString((QString *)0x198fe1);
        }
        if (in_EDX == 6) {
          QFileSystemEntry::filePath(in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd60,
                             &in_stack_fffffffffffffd58->m_filePath);
          QString::~QString((QString *)0x19901c);
        }
        else {
          QFileSystemEntry::path(in_RDI);
          QString::operator=((QString *)in_stack_fffffffffffffd60,
                             &in_stack_fffffffffffffd58->m_filePath);
          QString::~QString((QString *)0x199052);
        }
        QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_stack_fffffffffffffd60);
        break;
      case (QFileSystemMetaData *)0x5:
        QFileSystemEngine::bundleName(in_stack_fffffffffffffd58);
        QString::operator=((QString *)in_stack_fffffffffffffd60,
                           &in_stack_fffffffffffffd58->m_filePath);
        QString::~QString((QString *)0x1991c2);
        break;
      case (QFileSystemMetaData *)0x6:
        QFileSystemEngine::getJunctionTarget(in_RDI,in_stack_fffffffffffffd60);
        QFileSystemEntry::filePath(in_RDI);
        QString::operator=((QString *)in_stack_fffffffffffffd60,
                           &in_stack_fffffffffffffd58->m_filePath);
        QString::~QString((QString *)0x19917b);
        QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_stack_fffffffffffffd60);
        break;
      case (QFileSystemMetaData *)0x7:
        QFileSystemEngine::getRawLinkPath
                  ((QFileSystemEntry *)CONCAT44(in_EDX,uVar3),in_stack_fffffffffffffd80._8_8_);
        QFileSystemEntry::filePath(in_RDI);
        QString::operator=((QString *)in_stack_fffffffffffffd60,
                           &in_stack_fffffffffffffd58->m_filePath);
        QString::~QString((QString *)0x199118);
        QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_stack_fffffffffffffd60);
      }
    }
    else {
      pQVar2 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x199310);
      (*pQVar2->_vptr_QAbstractFileEngine[0x19])(local_258,pQVar2,(ulong)in_EDX);
      QString::operator=((QString *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->m_filePath
                        );
      QString::~QString((QString *)0x19933e);
    }
    bVar1 = QString::isNull((QString *)0x199348);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_stack_fffffffffffffd60)
      ;
      QString::operator=((QString *)CONCAT44(in_EDX,uVar3),in_stack_fffffffffffffdb0);
    }
    if ((int)in_RSI[8].birthTime_ < 0) {
      QString::operator=((QString *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->m_filePath
                        );
    }
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffd60,&in_stack_fffffffffffffd58->m_filePath);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &entry_00->m_filePath;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileInfoPrivate::getFileName(QAbstractFileEngine::FileName name) const
{
    if (cache_enabled && !fileNames[(int)name].isNull())
        return fileNames[(int)name];

    QString ret;
    if (fileEngine == nullptr) { // local file; use the QFileSystemEngine directly
        switch (name) {
            case QAbstractFileEngine::CanonicalName:
            case QAbstractFileEngine::CanonicalPathName: {
                QFileSystemEntry entry = QFileSystemEngine::canonicalName(fileEntry, metaData);
                if (cache_enabled) { // be smart and store both
                    fileNames[QAbstractFileEngine::CanonicalName] = entry.filePath();
                    fileNames[QAbstractFileEngine::CanonicalPathName] = entry.path();
                }
                if (name == QAbstractFileEngine::CanonicalName)
                    ret = entry.filePath();
                else
                    ret = entry.path();
                break;
            }
            case QAbstractFileEngine::AbsoluteLinkTarget:
                ret = QFileSystemEngine::getLinkTarget(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::RawLinkPath:
                ret = QFileSystemEngine::getRawLinkPath(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::JunctionName:
                ret = QFileSystemEngine::getJunctionTarget(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::BundleName:
                ret = QFileSystemEngine::bundleName(fileEntry);
                break;
            case QAbstractFileEngine::AbsoluteName:
            case QAbstractFileEngine::AbsolutePathName: {
                QFileSystemEntry entry = QFileSystemEngine::absoluteName(fileEntry);
                if (cache_enabled) { // be smart and store both
                    fileNames[QAbstractFileEngine::AbsoluteName] = entry.filePath();
                    fileNames[QAbstractFileEngine::AbsolutePathName] = entry.path();
                }
                if (name == QAbstractFileEngine::AbsoluteName)
                    ret = entry.filePath();
                else
                    ret = entry.path();
                break;
            }
            default: break;
        }
    } else {
        ret = fileEngine->fileName(name);
    }
    if (ret.isNull())
        ret = ""_L1;
    if (cache_enabled)
        fileNames[(int)name] = ret;
    return ret;
}